

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.hh
# Opt level: O0

void __thiscall molly::MollyError::~MollyError(MollyError *this)

{
  MollyError *this_local;
  
  ~MollyError(this);
  operator_delete(this);
  return;
}

Assistant:

MollyError(std::string message)
    : _message(message)
    {}